

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scriptpubkeyman.cpp
# Opt level: O0

optional<long> __thiscall
wallet::LegacyScriptPubKeyMan::GetOldestKeyPoolTime(LegacyScriptPubKeyMan *this)

{
  long lVar1;
  byte bVar2;
  bool bVar3;
  set<long,_std::less<long>,_std::allocator<long>_> *setKeyPool;
  WalletBatch *batch_00;
  undefined8 extraout_RDX;
  long *in_RDI;
  long in_FS_OFFSET;
  optional<long> oVar4;
  int64_t oldestKey;
  WalletBatch batch;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock11;
  undefined7 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3f;
  WalletDatabase *in_stack_ffffffffffffff40;
  undefined7 in_stack_ffffffffffffff48;
  undefined1 in_stack_ffffffffffffff4f;
  undefined8 in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  WalletBatch *in_stack_ffffffffffffff68;
  set<long,_std::less<long>,_std::allocator<long>_> *in_stack_ffffffffffffff70;
  undefined6 in_stack_ffffffffffffff78;
  undefined1 in_stack_ffffffffffffff7e;
  undefined1 in_stack_ffffffffffffff7f;
  _Storage<long,_true> local_18;
  undefined1 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld<AnnotatedMixin<std::recursive_mutex>>
            ((AnnotatedMixin<std::recursive_mutex> *)
             CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(in_stack_ffffffffffffff7f,
                      CONCAT16(in_stack_ffffffffffffff7e,in_stack_ffffffffffffff78)),
             (AnnotatedMixin<std::recursive_mutex> *)in_stack_ffffffffffffff70,
             (char *)in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
             (int)((ulong)in_stack_ffffffffffffff58 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffff58 >> 0x18,0));
  (**(code **)(*(long *)in_RDI[1] + 0x18))();
  WalletBatch::WalletBatch
            ((WalletBatch *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
             in_stack_ffffffffffffff40,(bool)in_stack_ffffffffffffff3f);
  GetOldestKeyTimeInPool(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  bVar2 = (**(code **)(*in_RDI + 0x60))();
  if (((bVar2 & 1) != 0) &&
     (bVar2 = (**(code **)(*(long *)in_RDI[1] + 0x30))((long *)in_RDI[1],0x2227c), (bVar2 & 1) != 0)
     ) {
    setKeyPool = (set<long,_std::less<long>,_std::allocator<long>_> *)
                 GetOldestKeyTimeInPool(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
    batch_00 = (WalletBatch *)
               std::max<long>((long *)in_stack_ffffffffffffff40,
                              (long *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38))
    ;
    bVar3 = std::set<long,_std::less<long>,_std::allocator<long>_>::empty
                      ((set<long,_std::less<long>,_std::allocator<long>_> *)
                       CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    if (!bVar3) {
      GetOldestKeyTimeInPool(setKeyPool,batch_00);
      std::max<long>((long *)in_stack_ffffffffffffff40,
                     (long *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
    }
  }
  std::optional<long>::optional<long,_true>
            ((optional<long> *)CONCAT17(in_stack_ffffffffffffff4f,in_stack_ffffffffffffff48),
             (long *)in_stack_ffffffffffffff40);
  WalletBatch::~WalletBatch
            ((WalletBatch *)CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::recursive_mutex>_> *)
             CONCAT17(in_stack_ffffffffffffff3f,in_stack_ffffffffffffff38));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>._9_7_ =
       (undefined7)((ulong)extraout_RDX >> 8);
  oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_engaged = (bool)local_10;
  oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>.
  _M_payload._M_value = local_18._M_value;
  return (optional<long>)
         oVar4.super__Optional_base<long,_true,_true>._M_payload.super__Optional_payload_base<long>;
}

Assistant:

std::optional<int64_t> LegacyScriptPubKeyMan::GetOldestKeyPoolTime() const
{
    LOCK(cs_KeyStore);

    WalletBatch batch(m_storage.GetDatabase());

    // load oldest key from keypool, get time and return
    int64_t oldestKey = GetOldestKeyTimeInPool(setExternalKeyPool, batch);
    if (IsHDEnabled() && m_storage.CanSupportFeature(FEATURE_HD_SPLIT)) {
        oldestKey = std::max(GetOldestKeyTimeInPool(setInternalKeyPool, batch), oldestKey);
        if (!set_pre_split_keypool.empty()) {
            oldestKey = std::max(GetOldestKeyTimeInPool(set_pre_split_keypool, batch), oldestKey);
        }
    }

    return oldestKey;
}